

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsExistingBranch(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_a30;
  QModelIndex local_a18;
  undefined1 local_a00 [8];
  value_type args;
  qsizetype local_9e0;
  QSignalSpy *local_9d8;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QLatin1Char local_99b;
  QChar local_99a;
  QVariant local_998;
  QChar local_974;
  QChar local_972;
  QModelIndex local_970;
  QVariant local_958;
  QChar local_934;
  QChar local_932;
  QModelIndex local_930;
  QVariant local_918;
  QChar local_8f4;
  QChar local_8f2;
  QModelIndex local_8f0;
  QVariant local_8d8;
  QChar local_8b4;
  QChar local_8b2;
  QModelIndex local_8b0;
  QVariant local_898;
  QChar local_874;
  QChar local_872;
  QModelIndex local_870;
  QVariant local_858;
  QChar local_836;
  QLatin1Char local_833;
  QChar local_832;
  QModelIndex local_830;
  QVariant local_818;
  QChar local_7f6;
  QLatin1Char local_7f3;
  QChar local_7f2;
  QModelIndex local_7f0;
  QVariant local_7d8;
  QChar local_7b4;
  QChar local_7b2;
  QModelIndex local_7b0;
  QVariant local_798;
  QChar local_776;
  QLatin1Char local_773;
  QChar local_772;
  QModelIndex local_770;
  QVariant local_758;
  QChar local_736;
  QLatin1Char local_733;
  QChar local_732;
  QModelIndex local_730;
  QVariant local_718;
  QChar local_6f6;
  QLatin1Char local_6f3;
  QChar local_6f2;
  QModelIndex local_6f0;
  QVariant local_6d8;
  QChar local_6b6;
  QLatin1Char local_6b3;
  QChar local_6b2;
  QModelIndex local_6b0;
  QVariant local_698;
  QChar local_672;
  QModelIndex local_670;
  QVariant local_658;
  QModelIndex local_638;
  QVariant local_620;
  QModelIndex local_600;
  QVariant local_5e8;
  QModelIndex local_5c8;
  QVariant local_5b0;
  QModelIndex local_590;
  QVariant local_578;
  QModelIndex local_558;
  QVariant local_540;
  QModelIndex local_520;
  QVariant local_508;
  QModelIndex local_4e8;
  QVariant local_4d0;
  QModelIndex local_4b0;
  QVariant local_498;
  QModelIndex local_478;
  QVariant local_460;
  QModelIndex local_440;
  QVariant local_428;
  QModelIndex local_408;
  QVariant local_3f0;
  undefined1 local_3d0 [24];
  QPersistentModelIndex local_3b8 [8];
  QPersistentModelIndex twoIndex;
  qint32 local_3ac;
  qsizetype local_3a8;
  QSignalSpy *local_3a0;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  qsizetype local_378;
  QSignalSpy *local_370;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  qsizetype local_348;
  QSignalSpy *local_340;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  qsizetype local_318;
  QSignalSpy *local_310;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QVariant local_2e8;
  undefined1 local_2c8 [24];
  QVariant local_2b0;
  undefined1 local_290 [30];
  QChar local_272;
  QVariant local_270;
  undefined1 local_250 [24];
  QVariant local_238;
  undefined1 local_218 [28];
  uint local_1fc;
  QSignalSpy *pQStack_1f8;
  int i;
  QSignalSpy *spyArr [2];
  undefined1 local_1e0 [8];
  QSignalSpy rowsMovedSpy;
  undefined1 local_158 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  undefined1 local_c0 [8];
  QModelIndex destIndex;
  undefined1 local_90 [8];
  QModelIndex parIndex;
  QModelIndex local_60;
  undefined1 local_38 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_38,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_60);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x3);
  QModelIndex::QModelIndex((QModelIndex *)&destIndex.m);
  GenericModel::index((int)local_90,(int)&probe + 8,(QModelIndex *)0x1);
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  GenericModel::index((int)local_c0,(int)&probe + 8,(QModelIndex *)0x2);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x6);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_158,(QObject *)&probe.field_0x8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_158);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x753);
  if ((bVar2 & 1) == 0) {
    rowsMovedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)local_1e0,(QObject *)&probe.field_0x8,
               "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)local_1e0);
    bVar2 = QTest::qVerify(bVar1,"rowsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x755);
    if ((bVar2 & 1) == 0) {
      rowsMovedSpy._124_4_ = 1;
    }
    else {
      pQStack_1f8 = (QSignalSpy *)local_158;
      spyArr[0] = (QSignalSpy *)local_1e0;
      for (local_1fc = 0; (int)local_1fc < 6; local_1fc = local_1fc + 1) {
        GenericModel::index((int)local_218,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QVariant::QVariant(&local_238,local_1fc);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_218,(int)&local_238)
        ;
        QVariant::~QVariant(&local_238);
        GenericModel::index((int)local_250,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QChar::QChar(&local_272,local_1fc + 0x61);
        QVariant::QVariant(&local_270,(QChar *)(ulong)(ushort)local_272.ucs);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_250,(int)&local_270)
        ;
        QVariant::~QVariant(&local_270);
        GenericModel::index((int)local_290,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QVariant::QVariant(&local_2b0,local_1fc + 10);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_290,(int)&local_2b0)
        ;
        QVariant::~QVariant(&local_2b0);
        GenericModel::index((int)local_2c8,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QChar::QChar((QChar *)((long)&__range1 + 6),local_1fc + 0x6b);
        QVariant::QVariant(&local_2e8,(QChar *)(ulong)__range1._6_2_);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_2c8,(int)&local_2e8)
        ;
        QVariant::~QVariant(&local_2e8);
      }
      bVar2 = GenericModel::moveRows
                        ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                         (int)local_c0);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, -1)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x75e);
      if ((bVar2 & 1) == 0) {
        rowsMovedSpy._124_4_ = 1;
      }
      else {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = &stack0xfffffffffffffe08;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_310 = *__end1;
          local_318 = QList<QList<QVariant>_>::count(&local_310->super_QList<QList<QVariant>_>);
          __range1_1._4_4_ = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_318,(qint32 *)((long)&__range1_1 + 4),"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x760);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            rowsMovedSpy._124_4_ = 1;
            goto LAB_0013d076;
          }
        }
        bVar2 = GenericModel::moveRows
                          ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                           (int)local_c0);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                               "!testModel.moveRows(parIndex, 2, 1, destIndex, 7)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x761);
        if ((bVar2 & 1) == 0) {
          rowsMovedSpy._124_4_ = 1;
        }
        else {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = &stack0xfffffffffffffe08;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_340 = *__end1_1;
            local_348 = QList<QList<QVariant>_>::count(&local_340->super_QList<QList<QVariant>_>);
            __range1_2._4_4_ = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_348,(qint32 *)((long)&__range1_2 + 4),"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x763);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              rowsMovedSpy._124_4_ = 1;
              goto LAB_0013d076;
            }
          }
          bVar2 = GenericModel::moveRows
                            ((QModelIndex *)&probe.field_0x8,(int)local_90,-1,(QModelIndex *)0x1,
                             (int)local_c0);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveRows(parIndex, -1, 1, destIndex, 1)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x764);
          if ((bVar2 & 1) == 0) {
            rowsMovedSpy._124_4_ = 1;
          }
          else {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = &stack0xfffffffffffffe08;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_370 = *__end1_2;
              local_378 = QList<QList<QVariant>_>::count(&local_370->super_QList<QList<QVariant>_>);
              __range1_3._4_4_ = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_378,(qint32 *)((long)&__range1_3 + 4),"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x766);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                rowsMovedSpy._124_4_ = 1;
                goto LAB_0013d076;
              }
            }
            bVar2 = GenericModel::moveRows
                              ((QModelIndex *)&probe.field_0x8,(int)local_90,6,(QModelIndex *)0x1,
                               (int)local_c0);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveRows(parIndex, 6, 1, destIndex, 1)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x767);
            if ((bVar2 & 1) == 0) {
              rowsMovedSpy._124_4_ = 1;
            }
            else {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = &stack0xfffffffffffffe08;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_3a0 = *__end1_3;
                local_3a8 = QList<QList<QVariant>_>::count
                                      (&local_3a0->super_QList<QList<QVariant>_>);
                local_3ac = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_3a8,&local_3ac,"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x769);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  rowsMovedSpy._124_4_ = 1;
                  goto LAB_0013d076;
                }
              }
              GenericModel::index((int)local_3d0,(int)&probe + 8,(QModelIndex *)0x2);
              QPersistentModelIndex::QPersistentModelIndex(local_3b8,(QModelIndex *)local_3d0);
              bVar2 = GenericModel::moveRows
                                ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x2,
                                 (int)local_c0);
              bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                     "testModel.moveRows(parIndex, 2, 2, destIndex, 1)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x76c);
              if ((bVar2 & 1) == 0) {
                rowsMovedSpy._124_4_ = 1;
              }
              else {
                iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                bVar2 = QTest::qCompare(iVar3,8,"testModel.rowCount(destIndex)","8",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x76d);
                if ((bVar2 & 1) == 0) {
                  rowsMovedSpy._124_4_ = 1;
                }
                else {
                  iVar3 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                  bVar2 = QTest::qCompare(iVar3,2,"testModel.columnCount(destIndex)","2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x76e);
                  if ((bVar2 & 1) == 0) {
                    rowsMovedSpy._124_4_ = 1;
                  }
                  else {
                    iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                    bVar2 = QTest::qCompare(iVar3,4,"testModel.rowCount(parIndex)","4",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x76f);
                    if ((bVar2 & 1) == 0) {
                      rowsMovedSpy._124_4_ = 1;
                    }
                    else {
                      GenericModel::index((int)&local_408,(int)&probe + 8,(QModelIndex *)0x0);
                      QModelIndex::data(&local_3f0,&local_408,0);
                      iVar3 = QVariant::toInt((bool *)&local_3f0);
                      bVar2 = QTest::qCompare(iVar3,0,
                                              "testModel.index(0, 0, parIndex).data().toInt()","0",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x770);
                      QVariant::~QVariant(&local_3f0);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        GenericModel::index((int)&local_440,(int)&probe + 8,(QModelIndex *)0x1);
                        QModelIndex::data(&local_428,&local_440,0);
                        iVar3 = QVariant::toInt((bool *)&local_428);
                        bVar2 = QTest::qCompare(iVar3,1,
                                                "testModel.index(1, 0, parIndex).data().toInt()","1"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x771);
                        QVariant::~QVariant(&local_428);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          GenericModel::index((int)&local_478,(int)&probe + 8,(QModelIndex *)0x2);
                          QModelIndex::data(&local_460,&local_478,0);
                          iVar3 = QVariant::toInt((bool *)&local_460);
                          bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x772);
                          QVariant::~QVariant(&local_460);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            GenericModel::index((int)&local_4b0,(int)&probe + 8,(QModelIndex *)0x3);
                            QModelIndex::data(&local_498,&local_4b0,0);
                            iVar3 = QVariant::toInt((bool *)&local_498);
                            bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x773);
                            QVariant::~QVariant(&local_498);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              GenericModel::index((int)&local_4e8,(int)&probe + 8,(QModelIndex *)0x0
                                                 );
                              QModelIndex::data(&local_4d0,&local_4e8,0);
                              iVar3 = QVariant::toInt((bool *)&local_4d0);
                              bVar2 = QTest::qCompare(iVar3,10,
                                                  "testModel.index(0, 0, destIndex).data().toInt()",
                                                  "10",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x774);
                              QVariant::~QVariant(&local_4d0);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                GenericModel::index((int)&local_520,(int)&probe + 8,
                                                    (QModelIndex *)0x1);
                                QModelIndex::data(&local_508,&local_520,0);
                                iVar3 = QVariant::toInt((bool *)&local_508);
                                bVar2 = QTest::qCompare(iVar3,2,
                                                  "testModel.index(1, 0, destIndex).data().toInt()",
                                                  "2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x775);
                                QVariant::~QVariant(&local_508);
                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                  GenericModel::index((int)&local_558,(int)&probe + 8,
                                                      (QModelIndex *)0x2);
                                  QModelIndex::data(&local_540,&local_558,0);
                                  iVar3 = QVariant::toInt((bool *)&local_540);
                                  bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(2, 0, destIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x776);
                                  QVariant::~QVariant(&local_540);
                                  if (((bVar2 ^ 0xff) & 1) == 0) {
                                    GenericModel::index((int)&local_590,(int)&probe + 8,
                                                        (QModelIndex *)0x3);
                                    QModelIndex::data(&local_578,&local_590,0);
                                    iVar3 = QVariant::toInt((bool *)&local_578);
                                    bVar2 = QTest::qCompare(iVar3,0xb,
                                                                                                                        
                                                  "testModel.index(3, 0, destIndex).data().toInt()",
                                                  "11",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x777);
                                    QVariant::~QVariant(&local_578);
                                    if (((bVar2 ^ 0xff) & 1) == 0) {
                                      GenericModel::index((int)&local_5c8,(int)&probe + 8,
                                                          (QModelIndex *)0x4);
                                      QModelIndex::data(&local_5b0,&local_5c8,0);
                                      iVar3 = QVariant::toInt((bool *)&local_5b0);
                                      bVar2 = QTest::qCompare(iVar3,0xc,
                                                                                                                            
                                                  "testModel.index(4, 0, destIndex).data().toInt()",
                                                  "12",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x778);
                                      QVariant::~QVariant(&local_5b0);
                                      if (((bVar2 ^ 0xff) & 1) == 0) {
                                        GenericModel::index((int)&local_600,(int)&probe + 8,
                                                            (QModelIndex *)0x5);
                                        QModelIndex::data(&local_5e8,&local_600,0);
                                        iVar3 = QVariant::toInt((bool *)&local_5e8);
                                        bVar2 = QTest::qCompare(iVar3,0xd,
                                                                                                                                
                                                  "testModel.index(5, 0, destIndex).data().toInt()",
                                                  "13",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x779);
                                        QVariant::~QVariant(&local_5e8);
                                        if (((bVar2 ^ 0xff) & 1) == 0) {
                                          GenericModel::index((int)&local_638,(int)&probe + 8,
                                                              (QModelIndex *)0x6);
                                          QModelIndex::data(&local_620,&local_638,0);
                                          iVar3 = QVariant::toInt((bool *)&local_620);
                                          bVar2 = QTest::qCompare(iVar3,0xe,
                                                                                                                                    
                                                  "testModel.index(6, 0, destIndex).data().toInt()",
                                                  "14",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77a);
                                          QVariant::~QVariant(&local_620);
                                          if (((bVar2 ^ 0xff) & 1) == 0) {
                                            GenericModel::index((int)&local_670,(int)&probe + 8,
                                                                (QModelIndex *)0x7);
                                            QModelIndex::data(&local_658,&local_670,0);
                                            iVar3 = QVariant::toInt((bool *)&local_658);
                                            bVar2 = QTest::qCompare(iVar3,0xf,
                                                                                                                                        
                                                  "testModel.index(7, 0, destIndex).data().toInt()",
                                                  "15",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77b);
                                            QVariant::~QVariant(&local_658);
                                            if (((bVar2 ^ 0xff) & 1) == 0) {
                                              GenericModel::index((int)&local_6b0,(int)&probe + 8,
                                                                  (QModelIndex *)0x0);
                                              QModelIndex::data(&local_698,&local_6b0,0);
                                              local_672 = QVariant::value<QChar>(&local_698);
                                              QLatin1Char::QLatin1Char(&local_6b3,'a');
                                              QChar::QChar(&local_6b2,local_6b3);
                                              bVar1 = QTest::qCompare<QChar,QChar>
                                                                (&local_672,&local_6b2,
                                                                                                                                  
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77c);
                                              QVariant::~QVariant(&local_698);
                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                GenericModel::index((int)&local_6f0,(int)&probe + 8,
                                                                    (QModelIndex *)0x1);
                                                QModelIndex::data(&local_6d8,&local_6f0,0);
                                                local_6b6 = QVariant::value<QChar>(&local_6d8);
                                                QLatin1Char::QLatin1Char(&local_6f3,'b');
                                                QChar::QChar(&local_6f2,local_6f3);
                                                bVar1 = QTest::qCompare<QChar,QChar>
                                                                  (&local_6b6,&local_6f2,
                                                                                                                                      
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77d);
                                                QVariant::~QVariant(&local_6d8);
                                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                  GenericModel::index((int)&local_730,
                                                                      (int)&probe + 8,
                                                                      (QModelIndex *)0x2);
                                                  QModelIndex::data(&local_718,&local_730,0);
                                                  local_6f6 = QVariant::value<QChar>(&local_718);
                                                  QLatin1Char::QLatin1Char(&local_733,'e');
                                                  QChar::QChar(&local_732,local_733);
                                                  bVar1 = QTest::qCompare<QChar,QChar>
                                                                    (&local_6f6,&local_732,
                                                                                                                                          
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77e);
                                                  QVariant::~QVariant(&local_718);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_770,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_758,&local_770,0);
                                                    local_736 = QVariant::value<QChar>(&local_758);
                                                    QLatin1Char::QLatin1Char(&local_773,'f');
                                                    QChar::QChar(&local_772,local_773);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_736,&local_772,
                                                                                                                                              
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x77f);
                                                  QVariant::~QVariant(&local_758);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_7b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_798,&local_7b0,0);
                                                    local_776 = QVariant::value<QChar>(&local_798);
                                                    QChar::QChar(&local_7b2,0x6b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_776,&local_7b2,
                                                                                                                                              
                                                  "testModel.index(0, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'a\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x780);
                                                  QVariant::~QVariant(&local_798);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_7f0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_7d8,&local_7f0,0);
                                                    local_7b4 = QVariant::value<QChar>(&local_7d8);
                                                    QLatin1Char::QLatin1Char(&local_7f3,'c');
                                                    QChar::QChar(&local_7f2,local_7f3);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_7b4,&local_7f2,
                                                                                                                                              
                                                  "testModel.index(1, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x781);
                                                  QVariant::~QVariant(&local_7d8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_830,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_818,&local_830,0);
                                                    local_7f6 = QVariant::value<QChar>(&local_818);
                                                    QLatin1Char::QLatin1Char(&local_833,'d');
                                                    QChar::QChar(&local_832,local_833);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_7f6,&local_832,
                                                                                                                                              
                                                  "testModel.index(2, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x782);
                                                  QVariant::~QVariant(&local_818);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_870,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_858,&local_870,0);
                                                    local_836 = QVariant::value<QChar>(&local_858);
                                                    QChar::QChar(&local_872,0x6c);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_836,&local_872,
                                                                                                                                              
                                                  "testModel.index(3, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'b\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x783);
                                                  QVariant::~QVariant(&local_858);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_8b0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_898,&local_8b0,0);
                                                    local_874 = QVariant::value<QChar>(&local_898);
                                                    QChar::QChar(&local_8b2,0x6d);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_874,&local_8b2,
                                                                                                                                              
                                                  "testModel.index(4, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'c\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x784);
                                                  QVariant::~QVariant(&local_898);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_8f0,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_8d8,&local_8f0,0);
                                                    local_8b4 = QVariant::value<QChar>(&local_8d8);
                                                    QChar::QChar(&local_8f2,0x6e);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_8b4,&local_8f2,
                                                                                                                                              
                                                  "testModel.index(5, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'d\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x785);
                                                  QVariant::~QVariant(&local_8d8);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_930,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x6);
                                                    QModelIndex::data(&local_918,&local_930,0);
                                                    local_8f4 = QVariant::value<QChar>(&local_918);
                                                    QChar::QChar(&local_932,0x6f);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_8f4,&local_932,
                                                                                                                                              
                                                  "testModel.index(6, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'e\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x786);
                                                  QVariant::~QVariant(&local_918);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    GenericModel::index((int)&local_970,
                                                                        (int)&probe + 8,
                                                                        (QModelIndex *)0x7);
                                                    QModelIndex::data(&local_958,&local_970,0);
                                                    local_934 = QVariant::value<QChar>(&local_958);
                                                    QChar::QChar(&local_972,0x70);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_934,&local_972,
                                                                                                                                              
                                                  "testModel.index(7, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(\'f\' + 10)",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x787);
                                                  QVariant::~QVariant(&local_958);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    QPersistentModelIndex::data((int)&local_998);
                                                    local_974 = QVariant::value<QChar>(&local_998);
                                                    QLatin1Char::QLatin1Char(&local_99b,'c');
                                                    QChar::QChar(&local_99a,local_99b);
                                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                                      (&local_974,&local_99a,
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x789);
                                                  QVariant::~QVariant(&local_998);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    iVar3 = QPersistentModelIndex::row();
                                                    bVar2 = QTest::qCompare(iVar3,1,"twoIndex.row()"
                                                                            ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x78a);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    QPersistentModelIndex::parent();
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      ((QModelIndex *)&__range1_4,
                                                                       (QModelIndex *)local_c0,
                                                                       "twoIndex.parent()",
                                                                       "destIndex",
                                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x78b);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    spy_4 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_4 = &stack0xfffffffffffffe08;
                                                    __begin1_4 = __end1_4;
                                                    for (; (QSignalSpy *)__end1_4 != spy_4;
                                                        __end1_4 = __end1_4 + 1) {
                                                      local_9d8 = *__end1_4;
                                                      local_9e0 = QList<QList<QVariant>_>::count
                                                                            (&local_9d8->
                                                                                                                                                            
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_9e0,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x78d);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_0013d06a;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_a00,
                                                             &local_9d8->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_a00,0);
                                                  QVariant::value<QModelIndex>(&local_a18,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_a18,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x78f);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_a00,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x790);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_a00,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,3,
                                                  "args.at(2).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x791);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_a00,3);
                                                    QVariant::value<QModelIndex>(&local_a30,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_a30,
                                                                       (QModelIndex *)local_c0,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","destIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x792);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_a00,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,1,
                                                  "args.at(4).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x793);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_a00);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_0013d06a;
                                                  }
                                                  rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  rowsMovedSpy._124_4_ = 1;
                                                }
                                              }
                                              else {
                                                rowsMovedSpy._124_4_ = 1;
                                              }
                                            }
                                            else {
                                              rowsMovedSpy._124_4_ = 1;
                                            }
                                          }
                                          else {
                                            rowsMovedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          rowsMovedSpy._124_4_ = 1;
                                        }
                                      }
                                      else {
                                        rowsMovedSpy._124_4_ = 1;
                                      }
                                    }
                                    else {
                                      rowsMovedSpy._124_4_ = 1;
                                    }
                                  }
                                  else {
                                    rowsMovedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  rowsMovedSpy._124_4_ = 1;
                                }
                              }
                              else {
                                rowsMovedSpy._124_4_ = 1;
                              }
                            }
                            else {
                              rowsMovedSpy._124_4_ = 1;
                            }
                          }
                          else {
                            rowsMovedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          rowsMovedSpy._124_4_ = 1;
                        }
                      }
                      else {
                        rowsMovedSpy._124_4_ = 1;
                      }
                    }
                  }
                }
              }
LAB_0013d06a:
              QPersistentModelIndex::~QPersistentModelIndex(local_3b8);
            }
          }
        }
      }
    }
LAB_0013d076:
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_1e0);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_158);
  ModelTest::~ModelTest((ModelTest *)local_38);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsExistingBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    const QModelIndex destIndex = testModel.index(2, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    testModel.insertColumns(0, 2, destIndex);
    testModel.insertRows(0, 6, destIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    for (int i = 0; i < 6; ++i) {
        testModel.setData(testModel.index(i, 0, parIndex), i);
        testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
        testModel.setData(testModel.index(i, 0, destIndex), 10 + i);
        testModel.setData(testModel.index(i, 1, destIndex), QChar('a' + i + 10));
    }

    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 2, destIndex, 1));
    QCOMPARE(testModel.rowCount(destIndex), 8);
    QCOMPARE(testModel.columnCount(destIndex), 2);
    QCOMPARE(testModel.rowCount(parIndex), 4);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 0, destIndex).data().toInt(), 10);
    QCOMPARE(testModel.index(1, 0, destIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(2, 0, destIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, destIndex).data().toInt(), 11);
    QCOMPARE(testModel.index(4, 0, destIndex).data().toInt(), 12);
    QCOMPARE(testModel.index(5, 0, destIndex).data().toInt(), 13);
    QCOMPARE(testModel.index(6, 0, destIndex).data().toInt(), 14);
    QCOMPARE(testModel.index(7, 0, destIndex).data().toInt(), 15);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(0, 1, destIndex).data().value<QChar>(), QChar('a' + 10));
    QCOMPARE(testModel.index(1, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(2, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, destIndex).data().value<QChar>(), QChar('b' + 10));
    QCOMPARE(testModel.index(4, 1, destIndex).data().value<QChar>(), QChar('c' + 10));
    QCOMPARE(testModel.index(5, 1, destIndex).data().value<QChar>(), QChar('d' + 10));
    QCOMPARE(testModel.index(6, 1, destIndex).data().value<QChar>(), QChar('e' + 10));
    QCOMPARE(testModel.index(7, 1, destIndex).data().value<QChar>(), QChar('f' + 10));

    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 1);
    QCOMPARE(twoIndex.parent(), destIndex);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 3);
        QCOMPARE(args.at(3).value<QModelIndex>(), destIndex);
        QCOMPARE(args.at(4).toInt(), 1);
    }
}